

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

Ray * __thiscall Camera::GetRay(Ray *__return_storage_ptr__,Camera *this,float s,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vec3 _origin;
  Vec3 _offset;
  Vec3 local_8c;
  Vec3 local_80;
  Vec3 local_74;
  double local_68;
  Vec3 local_60;
  Vec3 local_54;
  Vec3 local_48;
  Vec3 local_3c;
  Vec3 local_30 [2];
  
  fVar1 = this->m_lens_radius;
  if (fVar1 <= 0.0) {
    local_80.e[0] = 0.0;
    local_80.e[1] = 0.0;
    local_80.e[2] = 0.0;
  }
  else {
    random_in_unit_disk();
    operator*(fVar1,&local_80);
  }
  operator*(&local_8c,local_80.e[0]);
  operator*(&local_74,local_80.e[1]);
  operator+(&local_8c,&local_74);
  operator+(&this->m_origin,local_30);
  fVar1 = this->m_time_open;
  local_68 = drand48();
  fVar2 = this->m_time_open;
  fVar3 = this->m_time_close;
  operator*(s,&local_54);
  operator+(&this->m_lower_left_corner,&local_54);
  operator*(t,&local_60);
  operator+(&local_48,&local_60);
  operator-(&local_3c,&local_8c);
  (__return_storage_ptr__->m_origin).e[0] = local_8c.e[0];
  (__return_storage_ptr__->m_origin).e[1] = local_8c.e[1];
  (__return_storage_ptr__->m_origin).e[2] = local_8c.e[2];
  (__return_storage_ptr__->m_direction).e[0] = local_74.e[0];
  *(undefined8 *)((__return_storage_ptr__->m_direction).e + 1) = local_74.e._4_8_;
  __return_storage_ptr__->m_time = (fVar3 - fVar2) * (float)local_68 + fVar1;
  return __return_storage_ptr__;
}

Assistant:

Ray
Camera::GetRay(float s, float t) const
{ 
    Vec3  _rd     = (m_lens_radius > 0.0f) ? m_lens_radius * random_in_unit_disk() : Vec3(0.0f, 0.0f, 0.0f);
    Vec3  _offset = m_u * _rd.x() + m_v * _rd.y();
    Vec3  _origin = m_origin + _offset;
    float _time   = m_time_open + RANDOM_GEN()*(m_time_close - m_time_open);

    return Ray(_origin, m_lower_left_corner + s*m_horizontal + t*m_vertical - _origin, _time);
}